

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::StrPair::ParseText(StrPair *this,char *p,char *endTag,int strFlags)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_t __n;
  char *__s1;
  
  cVar1 = *endTag;
  __n = strlen(endTag);
  cVar2 = *p;
  __s1 = p;
  while( true ) {
    if (cVar2 == '\0') {
      return (char *)0x0;
    }
    if ((cVar2 == cVar1) && (iVar3 = strncmp(__s1,endTag,__n), iVar3 == 0)) break;
    cVar2 = __s1[1];
    __s1 = __s1 + 1;
  }
  Set(this,p,__s1,strFlags);
  return __s1 + __n;
}

Assistant:

char* StrPair::ParseText( char* p, const char* endTag, int strFlags )
{
    TIXMLASSERT( endTag && *endTag );

    char* start = p;
    char  endChar = *endTag;
    size_t length = strlen( endTag );

    // Inner loop of text parsing.
    while ( *p ) {
        if ( *p == endChar && strncmp( p, endTag, length ) == 0 ) {
            Set( start, p, strFlags );
            return p + length;
        }
        ++p;
    }
    return 0;
}